

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O0

void __thiscall dna_string::dna_string(dna_string *this,string *path,char TERM)

{
  char cVar1;
  streamoff sVar2;
  uchar *puVar3;
  char *pcVar4;
  ostream *poVar5;
  char in_DL;
  string *in_RSI;
  char *in_RDI;
  char c;
  uint64_t i;
  string BUF;
  ifstream ifs;
  allocator_type *in_stack_fffffffffffffc68;
  allocator_type *in_stack_fffffffffffffc70;
  size_type in_stack_fffffffffffffc78;
  vector<p_rank,_std::allocator<p_rank>_> *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffca0;
  uint64_t in_stack_fffffffffffffca8;
  dna_string *in_stack_fffffffffffffcb0;
  char local_2d1;
  ulong local_2d0;
  allocator local_2c1;
  string local_2c0 [32];
  char local_2a0 [96];
  dna_string *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffe90;
  string local_48 [32];
  fpos local_28 [23];
  char local_11;
  
  *in_RDI = '#';
  in_RDI[8] = '\0';
  in_RDI[9] = '\0';
  in_RDI[10] = '\0';
  in_RDI[0xb] = '\0';
  in_RDI[0xc] = '\0';
  in_RDI[0xd] = '\0';
  in_RDI[0xe] = '\0';
  in_RDI[0xf] = '\0';
  in_RDI[0x10] = '\0';
  in_RDI[0x11] = '\0';
  in_RDI[0x12] = '\0';
  in_RDI[0x13] = '\0';
  in_RDI[0x14] = '\0';
  in_RDI[0x15] = '\0';
  in_RDI[0x16] = '\0';
  in_RDI[0x17] = '\0';
  local_11 = in_DL;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13137c);
  in_RDI[0x30] = '\0';
  in_RDI[0x31] = '\0';
  in_RDI[0x32] = '\0';
  in_RDI[0x33] = '\0';
  in_RDI[0x34] = '\0';
  in_RDI[0x35] = '\0';
  in_RDI[0x36] = '\0';
  in_RDI[0x37] = '\0';
  std::vector<p_rank,_std::allocator<p_rank>_>::vector
            ((vector<p_rank,_std::allocator<p_rank>_> *)0x13139d);
  in_RDI[0x50] = '\0';
  in_RDI[0x51] = '\0';
  in_RDI[0x52] = '\0';
  in_RDI[0x53] = '\0';
  in_RDI[0x54] = '\0';
  in_RDI[0x55] = '\0';
  in_RDI[0x56] = '\0';
  in_RDI[0x57] = '\0';
  in_RDI[0x58] = '\0';
  in_RDI[0x59] = '\0';
  in_RDI[0x5a] = '\0';
  in_RDI[0x5b] = '\0';
  in_RDI[0x5c] = '\0';
  in_RDI[0x5d] = '\0';
  in_RDI[0x5e] = '\0';
  in_RDI[0x5f] = '\0';
  *in_RDI = local_11;
  std::__cxx11::string::string(local_48,in_RSI);
  local_28._0_16_ = filesize(in_stack_fffffffffffffe90);
  sVar2 = std::fpos::operator_cast_to_long(local_28);
  *(streamoff *)(in_RDI + 0x58) = sVar2;
  std::__cxx11::string::~string(local_48);
  *(ulong *)(in_RDI + 8) =
       ((*(long *)(in_RDI + 0x58) + 1U >> 0x20) + 1) -
       (ulong)((int)(*(long *)(in_RDI + 0x58) + 1U) == 0);
  *(ulong *)(in_RDI + 0x10) =
       ((*(long *)(in_RDI + 0x58) + 1U >> 7) + 1) -
       (ulong)((*(long *)(in_RDI + 0x58) + 1U & 0x7f) == 0);
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x10) << 6;
  std::allocator<p_rank>::allocator((allocator<p_rank> *)0x1314a8);
  std::vector<p_rank,_std::allocator<p_rank>_>::vector
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  std::vector<p_rank,_std::allocator<p_rank>_>::operator=
            ((vector<p_rank,_std::allocator<p_rank>_> *)in_stack_fffffffffffffc70,
             (vector<p_rank,_std::allocator<p_rank>_> *)in_stack_fffffffffffffc68);
  std::vector<p_rank,_std::allocator<p_rank>_>::~vector
            ((vector<p_rank,_std::allocator<p_rank>_> *)in_stack_fffffffffffffc70);
  std::allocator<p_rank>::~allocator((allocator<p_rank> *)0x1314fc);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x131531);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc80,
             in_stack_fffffffffffffc78,(value_type_conflict *)in_stack_fffffffffffffc70,
             in_stack_fffffffffffffc68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc70,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc70);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x13158b);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13159c);
  *(uchar **)(in_RDI + 0x30) = puVar3;
  while ((*(ulong *)(in_RDI + 0x30) & 0x3f) != 0) {
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
  }
  std::ifstream::ifstream(local_2a0,in_RSI,_S_in);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,0x80,'A',&local_2c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  local_2d0 = 0;
  while( true ) {
    if (*(ulong *)(in_RDI + 0x58) <= local_2d0) {
      if ((*(ulong *)(in_RDI + 0x58) & 0x7f) != 0) {
        set(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      }
      std::__cxx11::string::~string(local_2c0);
      std::ifstream::~ifstream(local_2a0);
      build_rank_support(in_stack_fffffffffffffdc0);
      return;
    }
    std::istream::read(local_2a0,(long)&local_2d1);
    cVar1 = local_2d1;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_2c0);
    *pcVar4 = cVar1;
    if ((((local_2d1 != 'A') && (local_2d1 != 'C')) && (local_2d1 != 'G')) &&
       ((local_2d1 != 'T' && (local_2d1 != local_11)))) break;
    if ((local_2d0 & 0x7f) == 0x7f) {
      set(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    }
    local_2d0 = local_2d0 + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "Error while reading file: read forbidden character \'");
  poVar5 = std::operator<<(poVar5,local_2d1);
  poVar5 = std::operator<<(poVar5,"\' (ASCII code ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)local_2d1);
  poVar5 = std::operator<<(poVar5,").");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Only A,C,G,T, and ");
  poVar5 = std::operator<<(poVar5,local_11);
  poVar5 = std::operator<<(poVar5," are admitted in the input BWT!");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (local_2d1 == 'N') {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Possible solution: it seems that your file contains \'N\' characters. Please, re-run with option -n."
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Possible solution: if the unknown character is the terminator, you can solve the problem by adding option \"-t "
                            );
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)local_2d1);
    poVar5 = std::operator<<(poVar5,"\".");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  exit(1);
}

Assistant:

dna_string(string path, char TERM = '#'){

		this->TERM = TERM;

		n = uint64_t(filesize(path));

		n_superblocks = (n+1)/SUPERBLOCK_SIZE + ((n+1)%SUPERBLOCK_SIZE != 0);
		n_blocks = (n+1)/BLOCK_SIZE + ((n+1)%BLOCK_SIZE != 0);
		nbytes = (n_blocks * BYTES_PER_BLOCK);//number of bytes effectively filled with data

		superblock_ranks = vector<p_rank>(n_superblocks);

		/*
		 * this block of code ensures that data is aligned by 64 bytes = 512 bits
		 */
		memory = vector<uint8_t>(nbytes+ALN,0);
		data = memory.data();
		while(uint64_t(data) % ALN != 0) data++;

		//cout << "alignment of data: " << (void*)data << endl;

		{

			ifstream ifs(path);

			string BUF(BLOCK_SIZE,'A');

			for(uint64_t i = 0; i<n; ++i){

				char c;

				ifs.read((char*)&c, sizeof(char));

				BUF[i%BLOCK_SIZE] = c;

				if(c!='A' and c!='C' and c!='G' and c!='T' and c!=TERM){
					cout << "Error while reading file: read forbidden character '" <<  c << "' (ASCII code " << int(c) << ")." << endl;
					cout << "Only A,C,G,T, and " << TERM << " are admitted in the input BWT!" << endl;

					if(c=='N'){

						cout << "Possible solution: it seems that your file contains 'N' characters. Please, re-run with option -n." << endl;

					}else{

						cout << "Possible solution: if the unknown character is the terminator, you can solve the problem by adding option \"-t " << int(c) << "\"." << endl;

					}

					exit(1);
				}

				//buffer is full
				if((i%BLOCK_SIZE) == BLOCK_SIZE-1) set(i/BLOCK_SIZE, BUF);

			}

			if(n % BLOCK_SIZE != 0) set(n/BLOCK_SIZE, BUF);

		}

		assert(check_content(path));
		build_rank_support();

	}